

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despot.cpp
# Opt level: O3

VNode * despot::DESPOT::FindBlocker(VNode *vnode)

{
  double dVar1;
  QNode *pQVar2;
  int iVar3;
  double dVar4;
  ValuedAction VVar5;
  
  if (vnode != (VNode *)0x0) {
    iVar3 = 1;
    do {
      dVar1 = vnode->utility_upper_bound;
      dVar4 = (double)iVar3 * DAT_00192dd0;
      VVar5 = VNode::default_move(vnode);
      if (dVar1 - dVar4 <= VVar5.value) {
        return vnode;
      }
      pQVar2 = VNode::parent(vnode);
      if (pQVar2 == (QNode *)0x0) {
        return (VNode *)0x0;
      }
      iVar3 = iVar3 + 1;
      pQVar2 = VNode::parent(vnode);
      vnode = QNode::parent(pQVar2);
    } while (vnode != (VNode *)0x0);
  }
  return (VNode *)0x0;
}

Assistant:

VNode* DESPOT::FindBlocker(VNode* vnode) {
	VNode* cur = vnode;
	int count = 1;
	while (cur != NULL) {
		if (cur->utility_upper_bound - count * Globals::config.pruning_constant
			<= cur->default_move().value) {
			break;
		}
		count++;
		if (cur->parent() == NULL) {
			cur = NULL;
		} else {
			cur = cur->parent()->parent();
		}
	}
	return cur;
}